

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_url.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  int rc;
  char **argv_local;
  int argc_local;
  
  iVar1 = parse_args(argc,argv);
  if (iVar1 < 0) {
    argv_local._4_4_ = (uint)(iVar1 != -1);
  }
  else {
    argv_local._4_4_ = decode(argv[argc + -1]);
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char** argv)
{
    int rc;

    if ((rc = parse_args(argc, argv)) < 0)
        return rc == EXIT_OK ? EXIT_SUCCESS : EXIT_FAILURE;

    return decode(argv[argc - 1]);
}